

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O2

void __thiscall Assimp::MDL::IntSharedData_MDL7::~IntSharedData_MDL7(IntSharedData_MDL7 *this)

{
  IntBone_MDL7 **ppIVar1;
  IntBone_MDL7 *this_00;
  uint m;
  ulong uVar2;
  
  if (this->apcOutBones != (IntBone_MDL7 **)0x0) {
    for (uVar2 = 0; ppIVar1 = this->apcOutBones, uVar2 < this->iNum; uVar2 = uVar2 + 1) {
      this_00 = ppIVar1[uVar2];
      if (this_00 != (IntBone_MDL7 *)0x0) {
        IntBone_MDL7::~IntBone_MDL7(this_00);
      }
      operator_delete(this_00);
    }
    if (ppIVar1 != (IntBone_MDL7 **)0x0) {
      operator_delete__(ppIVar1);
    }
  }
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            (&(this->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)this);
  return;
}

Assistant:

~IntSharedData_MDL7()
    {
        // kill all bones
        if (this->apcOutBones)
        {
            for (unsigned int m = 0; m < iNum;++m)
                delete this->apcOutBones[m];
            delete[] this->apcOutBones;
        }
    }